

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O3

string * banksia::getFileName(string *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  long lVar2;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  lVar2 = std::__cxx11::string::find_last_of((char *)path,0x19c46e,0xffffffffffffffff);
  if (lVar2 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  }
  lVar2 = std::__cxx11::string::find_last_of
                    ((char *)__return_storage_ptr__,0x187020,0xffffffffffffffff);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_30);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getFileName(const std::string& path) {
        auto pos = path.find_last_of("/\\");
        std::string str = pos != std::string::npos ? path.substr(pos + 1) : path;
        pos = str.find_last_of(".");
        if (pos != std::string::npos) {
            str = str.substr(0, pos);
        }
        return str;
    }